

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall
asmjit::_abi_1_10::BaseBuilder::embedConstPool(BaseBuilder *this,Label *label,ConstPool *pool)

{
  bool bVar1;
  Error EVar2;
  Error EVar3;
  Error EVar4;
  size_t sVar5;
  ConstPool *in_RDX;
  undefined8 in_RSI;
  BaseEmitter *in_RDI;
  void *unaff_retaddr;
  TypeId in_stack_0000000f;
  EmbedDataNode **in_stack_00000010;
  Error _err_2;
  EmbedDataNode *node;
  Error _err_1;
  Error _err;
  Label *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  Error in_stack_ffffffffffffffcc;
  BaseBuilder *in_stack_ffffffffffffffd0;
  BaseEmitter *repeatCount;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI->_code == (CodeHolder *)0x0) {
    EVar2 = DebugUtils::errored(5);
  }
  else {
    repeatCount = in_RDI;
    bVar1 = BaseEmitter::isLabelValid(in_RDI,in_stack_ffffffffffffffb8);
    if (bVar1) {
      sVar5 = ConstPool::alignment(in_RDX);
      EVar3 = (*in_RDI->_vptr_BaseEmitter[9])(in_RDI,1,sVar5 & 0xffffffff);
      EVar2 = EVar3;
      if ((EVar3 == 0) &&
         (EVar4 = (*in_RDI->_vptr_BaseEmitter[6])(in_RDI,in_RSI), EVar2 = EVar4, EVar4 == 0)) {
        ConstPool::size(in_RDX);
        EVar2 = newEmbedDataNode((BaseBuilder *)node,in_stack_00000010,in_stack_0000000f,
                                 unaff_retaddr,
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 (size_t)repeatCount);
        if (EVar2 == 0) {
          EmbedDataNode::data((EmbedDataNode *)in_RDI);
          ConstPool::fill(in_RDX,(void *)CONCAT44(EVar3,EVar4));
          addNode(in_stack_ffffffffffffffd0,(BaseNode *)CONCAT44(EVar2,in_stack_ffffffffffffffc8));
          EVar2 = 0;
        }
      }
    }
    else {
      DebugUtils::errored(0xc);
      EVar2 = BaseEmitter::reportError
                        (&in_stack_ffffffffffffffd0->super_BaseEmitter,in_stack_ffffffffffffffcc,
                         (char *)in_RDI);
    }
  }
  return EVar2;
}

Assistant:

Error BaseBuilder::embedConstPool(const Label& label, const ConstPool& pool) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (!isLabelValid(label))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  ASMJIT_PROPAGATE(align(AlignMode::kData, uint32_t(pool.alignment())));
  ASMJIT_PROPAGATE(bind(label));

  EmbedDataNode* node;
  ASMJIT_PROPAGATE(newEmbedDataNode(&node, TypeId::kUInt8, nullptr, pool.size()));
  ASMJIT_ASSUME(node != nullptr);

  pool.fill(node->data());
  addNode(node);
  return kErrorOk;
}